

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall boost::runtime::cla::parser::usage(parser *this,ostream *ostr,cstring *param_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  trie_ptr local_f0;
  locate_result local_e0;
  element_type *local_68;
  shared_count sStack_60;
  cstring local_58;
  pointer local_40;
  pointer local_38;
  cstring local_30;
  
  if (param_name->m_end == param_name->m_begin) {
    std::__ostream_insert<char,std::char_traits<char>>(ostr,"Usage: ",7);
    paVar1 = &local_e0.first.m_prefix.field_2;
    local_e0.first.m_prefix._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,(this->m_program_name).m_begin,(this->m_program_name).m_end);
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,local_e0.first.m_prefix._M_dataplus._M_p,
               local_e0.first.m_prefix._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.first.m_prefix._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0.first.m_prefix._M_dataplus._M_p,
                      local_e0.first.m_prefix.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(ostr," [Boost.Test argument]... ",0x1a);
    sVar2 = (this->m_end_of_param_indicator)._M_string_length;
    if (sVar2 != 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (ostr,(this->m_end_of_param_indicator)._M_dataplus._M_p,sVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," [custom test module argument]...",0x21);
    }
    std::__ostream_insert<char,std::char_traits<char>>(ostr,"\n",1);
  }
  else {
    pmVar3 = std::
             map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
             ::operator[](&this->m_param_trie,(key_type *)&help_prefix);
    local_f0.px = pmVar3->px;
    local_f0.pn.pi_ = (pmVar3->pn).pi_;
    if (local_f0.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_f0.pn.pi_)->use_count_ = (local_f0.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_58.m_begin = param_name->m_begin;
    local_58.m_end = param_name->m_end;
    local_30.m_begin = "";
    local_30.m_end = "";
    locate_parameter(&local_e0,this,&local_f0,&local_58,&local_30);
    local_68 = local_e0.second.px;
    sStack_60.pi_ = local_e0.second.pn.pi_;
    local_e0.second.px = (element_type *)0x0;
    local_e0.second.pn.pi_ = (sp_counted_base *)0x0;
    detail::shared_count::~shared_count(&local_e0.second.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.first.m_value_separator._M_dataplus._M_p !=
        &local_e0.first.m_value_separator.field_2) {
      operator_delete(local_e0.first.m_value_separator._M_dataplus._M_p,
                      local_e0.first.m_value_separator.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.first.m_tag._M_dataplus._M_p != &local_e0.first.m_tag.field_2) {
      operator_delete(local_e0.first.m_tag._M_dataplus._M_p,
                      local_e0.first.m_tag.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.first.m_prefix._M_dataplus._M_p != &local_e0.first.m_prefix.field_2) {
      operator_delete(local_e0.first.m_prefix._M_dataplus._M_p,
                      local_e0.first.m_prefix.field_2._M_allocated_capacity + 1);
    }
    detail::shared_count::~shared_count(&local_f0.pn);
    if (local_68 == (element_type *)0x0) {
      __assert_fail("px != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                    ,0x2de,
                    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::basic_param>::operator->() const [T = boost::runtime::basic_param]"
                   );
    }
    local_40 = (this->m_negation_prefix)._M_dataplus._M_p;
    local_38 = local_40 + (this->m_negation_prefix)._M_string_length;
    (*local_68->_vptr_basic_param[5])(local_68,ostr);
    detail::shared_count::~shared_count(&sStack_60);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (ostr,"\nFor detailed help on Boost.Test parameters use:\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"  ",2);
  paVar1 = &local_e0.first.m_prefix.field_2;
  local_e0.first.m_prefix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,(this->m_program_name).m_begin,(this->m_program_name).m_end);
  std::__ostream_insert<char,std::char_traits<char>>
            (ostr,local_e0.first.m_prefix._M_dataplus._M_p,local_e0.first.m_prefix._M_string_length)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first.m_prefix._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0.first.m_prefix._M_dataplus._M_p,
                    local_e0.first.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostr," --help\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"or\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"  ",2);
  local_e0.first.m_prefix._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,(this->m_program_name).m_begin,(this->m_program_name).m_end);
  std::__ostream_insert<char,std::char_traits<char>>
            (ostr,local_e0.first.m_prefix._M_dataplus._M_p,local_e0.first.m_prefix._M_string_length)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first.m_prefix._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0.first.m_prefix._M_dataplus._M_p,
                    local_e0.first.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostr," --help=<parameter name>\n",0x19);
  return;
}

Assistant:

void
    usage( std::ostream& ostr, cstring param_name = cstring() )
    {
        if( !param_name.is_empty() ) {
            basic_param_ptr param = locate_parameter( m_param_trie[help_prefix], param_name, "" ).second;
            param->usage( ostr, m_negation_prefix );
        }
        else {
            ostr << "Usage: " << m_program_name << " [Boost.Test argument]... ";
            if( !m_end_of_param_indicator.empty() )
                ostr << m_end_of_param_indicator << " [custom test module argument]...";
            ostr << "\n";
        }

        ostr << "\nFor detailed help on Boost.Test parameters use:\n"
             << "  " << m_program_name << " --help\n"
             << "or\n"
             << "  " << m_program_name << " --help=<parameter name>\n";
    }